

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Label.h
# Opt level: O1

void __thiscall gui::LabelStyle::~LabelStyle(LabelStyle *this)

{
  pointer pVVar1;
  pointer puVar2;
  
  (this->super_Style)._vptr_Style = (_func_int **)&PTR__LabelStyle_001e75b0;
  (this->text_).super_Drawable._vptr_Drawable = (_func_int **)&PTR__Text_001e8638;
  (this->text_).super_Transformable._vptr_Transformable = (_func_int **)&PTR__Text_001e8660;
  (this->text_).m_outlineVertices.super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__VertexArray_001e86b8;
  pVVar1 = (this->text_).m_outlineVertices.m_vertices.
           super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1);
  }
  (this->text_).m_vertices.super_Drawable._vptr_Drawable = (_func_int **)&PTR__VertexArray_001e86b8;
  pVVar1 = (this->text_).m_vertices.m_vertices.
           super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1);
  }
  puVar2 = (this->text_).m_string.m_string._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)puVar2 != &(this->text_).m_string.m_string.field_2) {
    operator_delete(puVar2);
  }
  sf::Transformable::~Transformable(&(this->text_).super_Transformable);
  return;
}

Assistant:

virtual ~LabelStyle() = default;